

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_tessellator.cc
# Opt level: O2

void __thiscall
S2EdgeTessellator::AppendProjected
          (S2EdgeTessellator *this,S2Point *a,S2Point *b,
          vector<Vector2<double>,_std::allocator<Vector2<double>_>_> *vertices)

{
  bool bVar1;
  ostream *poVar2;
  VType extraout_XMM0_Qa;
  VType in_XMM1_Qa;
  R2Point local_48;
  R2Point pb;
  
  (*this->proj_->_vptr_Projection[2])();
  local_48.c_[1] = in_XMM1_Qa;
  local_48.c_[0] = extraout_XMM0_Qa;
  if (*(long *)vertices == *(long *)(vertices + 8)) {
    std::vector<Vector2<double>,_std::allocator<Vector2<double>_>_>::push_back(vertices,&local_48);
  }
  else {
    local_48 = S2::Projection::WrapDestination
                         (this->proj_,(R2Point *)(*(long *)(vertices + 8) + -0x10),&local_48);
    in_XMM1_Qa = local_48.c_[1];
    bVar1 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator==
                      ((BasicVector<Vector2,_double,_2UL> *)(*(long *)(vertices + 8) + -0x10),
                       &local_48);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&pb,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_tessellator.cc"
                 ,0xda,kFatal,(ostream *)&std::cerr);
      poVar2 = std::operator<<((ostream *)pb.c_[1],"Check failed: (vertices->back()) == (pa) ");
      std::operator<<(poVar2,"Appended edges must form a chain");
      abort();
    }
  }
  (*this->proj_->_vptr_Projection[2])(this->proj_,b);
  pb.c_[1] = in_XMM1_Qa;
  AppendProjected(this,&local_48,a,&pb,b,vertices);
  return;
}

Assistant:

void S2EdgeTessellator::AppendProjected(
    const S2Point& a, const S2Point& b, vector<R2Point>* vertices) const {
  R2Point pa = proj_.Project(a);
  if (vertices->empty()) {
    vertices->push_back(pa);
  } else {
    pa = proj_.WrapDestination(vertices->back(), pa);
    S2_DCHECK_EQ(vertices->back(), pa) << "Appended edges must form a chain";
  }
  R2Point pb = proj_.Project(b);
  AppendProjected(pa, a, pb, b, vertices);
}